

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

void __thiscall
soul::heart::StructElement::visitExpressions
          (StructElement *this,ExpressionVisitorFn fn,AccessType mode)

{
  AccessType local_1c;
  
  (*(((this->parent).object)->super_Object)._vptr_Object[3])();
  local_1c = mode;
  if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*fn->_M_invoker)((_Any_data *)fn,&this->parent,&local_1c);
  if ((StructElement *)(this->parent).object != this) {
    return;
  }
  throwInternalCompilerError("parent != *this","visitExpressions",0x28f);
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn, AccessType mode) override
        {
            parent->visitExpressions (fn, mode);
            fn (parent, mode);
            SOUL_ASSERT (parent != *this);
        }